

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O0

int testDatumAttributes(void)

{
  mapped_type *pmVar1;
  string outString;
  VRAttributeList alist;
  VRDatumInt a;
  string testString;
  int loopctr;
  int out;
  undefined4 in_stack_fffffffffffffd58;
  VRInt in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  VRDatum *in_stack_fffffffffffffd68;
  VRDatum *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd90;
  mapped_type *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [24];
  VRDatum_conflict *in_stack_fffffffffffffe28;
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [87];
  allocator<char> local_149;
  string local_148 [39];
  undefined1 local_121 [40];
  allocator<char> local_f9;
  string local_f8 [207];
  allocator<char> local_29;
  string local_28 [32];
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    std::allocator<char>::~allocator(&local_29);
    MinVR::VRDatumInt::VRDatumInt
              ((VRDatumInt *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd5c);
    MinVR::VRDatum::getAttributeList_abi_cxx11_(in_stack_fffffffffffffd68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::operator=((string *)pmVar1,"11");
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    in_stack_fffffffffffffda0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    in_stack_fffffffffffffd98 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffd98,"2");
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
    in_stack_fffffffffffffd90 = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::operator=((string *)pmVar1,"3");
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    MinVR::VRDatum::setAttributeList
              ((VRDatum *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (VRAttributeList *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x10aa3d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    MinVR::VRDatum::setAttributeValue
              (in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68,
               (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    in_stack_fffffffffffffd70 = (VRDatum *)&local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    in_stack_fffffffffffffd68 = (VRDatum *)&local_219;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    MinVR::VRDatum::setAttributeValue
              (in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68,
               (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    MinVR::VRDatum::getAttributeListAsString_abi_cxx11_(in_stack_fffffffffffffe28);
    in_stack_fffffffffffffd64 = std::__cxx11::string::compare(local_240);
    local_4 = in_stack_fffffffffffffd64 + local_4;
    std::__cxx11::string::~string(local_240);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x10abec);
    MinVR::VRDatumInt::~VRDatumInt((VRDatumInt *)0x10abf9);
    std::__cxx11::string::~string(local_28);
  }
  return local_4;
}

Assistant:

int testDatumAttributes() {

  int out = 0;

  LOOP {
    std::string testString = " four=\"4\" one=\"1\" three=\"3\" two=\"2\"";

    MinVR::VRDatumInt a = MinVR::VRDatumInt(37);

    MinVR::VRDatum::VRAttributeList alist = a.getAttributeList();

    alist["one"] = "11";
    alist["two"] = "2";
    alist["three"] = "3";

    a.setAttributeList(alist);

    a.setAttributeValue("one", "1");
    a.setAttributeValue("four", "4");

    std::string outString = a.getAttributeListAsString();

    //  std::cout << outString << std::endl;
    //  std::cout << testString << std::endl;

    out += outString.compare(testString);

  }